

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.c
# Opt level: O1

int alsa_allocate_recorder(ALLEGRO_AUDIO_RECORDER *r)

{
  uint uVar1;
  ALLEGRO_AUDIO_DEPTH AVar2;
  undefined4 uVar3;
  long lVar4;
  long lVar5;
  char cVar6;
  int iVar7;
  undefined8 uVar8;
  char *pcVar9;
  long *plVar10;
  size_t sVar11;
  ALLEGRO_THREAD *pAVar12;
  char *pcVar13;
  uint frequency;
  uint local_34;
  
  uVar1 = r->frequency;
  uVar8 = al_get_system_config();
  pcVar9 = (char *)al_get_config_value(uVar8,"alsa","capture_device");
  if (pcVar9 == (char *)0x0) {
    pcVar13 = "default";
  }
  else {
    pcVar13 = "default";
    if (*pcVar9 != '\0') {
      pcVar13 = pcVar9;
    }
  }
  plVar10 = (long *)al_calloc_with_context
                              (1,0x10,0x32a,
                               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                               ,"alsa_allocate_recorder");
  if (plVar10 == (long *)0x0) {
    return 1;
  }
  AVar2 = r->depth;
  if (((ulong)AVar2 < 0xb) && ((0x70fU >> (AVar2 & 0x1f) & 1) != 0)) {
    uVar3 = *(undefined4 *)(&DAT_001147b8 + (ulong)AVar2 * 4);
    iVar7 = snd_pcm_open(plVar10,pcVar13,1,0);
    if (iVar7 < 0) {
      cVar6 = _al_trace_prefix("alsa",3,
                               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                               ,0x341,"alsa_allocate_recorder");
      if (cVar6 != '\0') {
        uVar8 = snd_strerror(iVar7);
        _al_trace_suffix("%s: %s\n",uVar8,
                         "snd_pcm_open(&data->capture_handle, device, SND_PCM_STREAM_CAPTURE, 0)");
      }
      if (iVar7 < 0) goto LAB_001105a6;
    }
    iVar7 = snd_pcm_hw_params_malloc(plVar10 + 1);
    if (iVar7 < 0) {
      cVar6 = _al_trace_prefix("alsa",3,
                               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                               ,0x342,"alsa_allocate_recorder");
      if (cVar6 != '\0') {
        uVar8 = snd_strerror(iVar7);
        _al_trace_suffix("%s: %s\n",uVar8,"snd_pcm_hw_params_malloc(&data->hw_params)");
      }
      if (iVar7 < 0) goto LAB_001105a6;
    }
    iVar7 = snd_pcm_hw_params_any(*plVar10,plVar10[1]);
    if (iVar7 < 0) {
      cVar6 = _al_trace_prefix("alsa",3,
                               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                               ,0x343,"alsa_allocate_recorder");
      if (cVar6 != '\0') {
        uVar8 = snd_strerror(iVar7);
        _al_trace_suffix("%s: %s\n",uVar8,
                         "snd_pcm_hw_params_any(data->capture_handle, data->hw_params)");
      }
      if (iVar7 < 0) goto LAB_001105a6;
    }
    iVar7 = snd_pcm_hw_params_set_access(*plVar10,plVar10[1],3);
    if (iVar7 < 0) {
      cVar6 = _al_trace_prefix("alsa",3,
                               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                               ,0x344,"alsa_allocate_recorder");
      if (cVar6 != '\0') {
        uVar8 = snd_strerror(iVar7);
        _al_trace_suffix("%s: %s\n",uVar8,
                         "snd_pcm_hw_params_set_access(data->capture_handle, data->hw_params, SND_PCM_ACCESS_RW_INTERLEAVED)"
                        );
      }
      if (iVar7 < 0) goto LAB_001105a6;
    }
    iVar7 = snd_pcm_hw_params_set_format(*plVar10,plVar10[1],uVar3);
    if (iVar7 < 0) {
      cVar6 = _al_trace_prefix("alsa",3,
                               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                               ,0x345,"alsa_allocate_recorder");
      if (cVar6 != '\0') {
        uVar8 = snd_strerror(iVar7);
        _al_trace_suffix("%s: %s\n",uVar8,
                         "snd_pcm_hw_params_set_format(data->capture_handle, data->hw_params, format)"
                        );
      }
      if (iVar7 < 0) goto LAB_001105a6;
    }
    iVar7 = snd_pcm_hw_params_set_rate_near(*plVar10,plVar10[1],&local_34,0);
    if (iVar7 < 0) {
      cVar6 = _al_trace_prefix("alsa",3,
                               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                               ,0x346,"alsa_allocate_recorder");
      if (cVar6 != '\0') {
        uVar8 = snd_strerror(iVar7);
        _al_trace_suffix("%s: %s\n",uVar8,
                         "snd_pcm_hw_params_set_rate_near(data->capture_handle, data->hw_params, &frequency, 0)"
                        );
      }
      if (iVar7 < 0) goto LAB_001105a6;
    }
    if (uVar1 == r->frequency) {
      lVar4 = *plVar10;
      lVar5 = plVar10[1];
      sVar11 = al_get_channel_count(r->chan_conf);
      iVar7 = snd_pcm_hw_params_set_channels(lVar4,lVar5,sVar11 & 0xffffffff);
      if (iVar7 < 0) {
        cVar6 = _al_trace_prefix("alsa",3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                                 ,0x34d,"alsa_allocate_recorder");
        if (cVar6 != '\0') {
          uVar8 = snd_strerror(iVar7);
          _al_trace_suffix("%s: %s\n",uVar8,
                           "snd_pcm_hw_params_set_channels(data->capture_handle, data->hw_params, al_get_channel_count(r->chan_conf))"
                          );
        }
        if (iVar7 < 0) goto LAB_001105a6;
      }
      iVar7 = snd_pcm_hw_params(*plVar10,plVar10[1]);
      if (iVar7 < 0) {
        cVar6 = _al_trace_prefix("alsa",3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                                 ,0x34e,"alsa_allocate_recorder");
        if (cVar6 != '\0') {
          uVar8 = snd_strerror(iVar7);
          _al_trace_suffix("%s: %s\n",uVar8,
                           "snd_pcm_hw_params(data->capture_handle, data->hw_params)");
        }
        if (iVar7 < 0) goto LAB_001105a6;
      }
      iVar7 = snd_pcm_prepare(*plVar10);
      if (iVar7 < 0) {
        cVar6 = _al_trace_prefix("alsa",3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                                 ,0x350,"alsa_allocate_recorder");
        if (cVar6 != '\0') {
          uVar8 = snd_strerror(iVar7);
          _al_trace_suffix("%s: %s\n",uVar8,"snd_pcm_prepare(data->capture_handle)");
        }
        if (iVar7 < 0) goto LAB_001105a6;
      }
      r->extra = plVar10;
      pAVar12 = (ALLEGRO_THREAD *)al_create_thread(alsa_update_recorder,r);
      r->thread = pAVar12;
      return 0;
    }
    local_34 = uVar1;
    cVar6 = _al_trace_prefix("alsa",3,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                             ,0x349,"alsa_allocate_recorder");
    if (cVar6 != '\0') {
      _al_trace_suffix("Unsupported rate! Requested %u, got %iu.\n",r->frequency,local_34);
    }
  }
LAB_001105a6:
  if (plVar10[1] != 0) {
    snd_pcm_hw_params_free();
  }
  if (*plVar10 != 0) {
    snd_pcm_close();
  }
  al_free_with_context
            (plVar10,0x360,
             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
             ,"alsa_allocate_recorder");
  return 1;
}

Assistant:

static int alsa_allocate_recorder(ALLEGRO_AUDIO_RECORDER *r)
{
   ALSA_RECORDER_DATA *data;
   unsigned int frequency = r->frequency;
   snd_pcm_format_t format;
   const char *device = default_device;
   const char *config_device;
   config_device =
      al_get_config_value(al_get_system_config(), "alsa", "capture_device");
   if (config_device && config_device[0] != '\0')
      device = config_device;

   data = al_calloc(1, sizeof(*data));
   
   if (!data) {
      goto Error;
   }
   
   if (r->depth == ALLEGRO_AUDIO_DEPTH_INT8)
      format = SND_PCM_FORMAT_S8;
   else if (r->depth == ALLEGRO_AUDIO_DEPTH_UINT8)
      format = SND_PCM_FORMAT_U8;
   else if (r->depth == ALLEGRO_AUDIO_DEPTH_INT16)
      format = SND_PCM_FORMAT_S16;
   else if (r->depth == ALLEGRO_AUDIO_DEPTH_UINT16)
      format = SND_PCM_FORMAT_U16;
   else if (r->depth == ALLEGRO_AUDIO_DEPTH_INT24)
      format = SND_PCM_FORMAT_S24;
   else if (r->depth == ALLEGRO_AUDIO_DEPTH_UINT24)
      format = SND_PCM_FORMAT_U24;
   else if (r->depth == ALLEGRO_AUDIO_DEPTH_FLOAT32)
      format = SND_PCM_FORMAT_FLOAT;
   else
      goto Error;
   
   ALSA_CHECK(snd_pcm_open(&data->capture_handle, device, SND_PCM_STREAM_CAPTURE, 0));
   ALSA_CHECK(snd_pcm_hw_params_malloc(&data->hw_params));
   ALSA_CHECK(snd_pcm_hw_params_any(data->capture_handle, data->hw_params));
   ALSA_CHECK(snd_pcm_hw_params_set_access(data->capture_handle, data->hw_params, SND_PCM_ACCESS_RW_INTERLEAVED));
   ALSA_CHECK(snd_pcm_hw_params_set_format(data->capture_handle, data->hw_params, format));
   ALSA_CHECK(snd_pcm_hw_params_set_rate_near(data->capture_handle, data->hw_params, &frequency, 0));
   
   if (frequency != r->frequency) {
      ALLEGRO_ERROR("Unsupported rate! Requested %u, got %iu.\n", r->frequency, frequency);
      goto Error;
   }
   
   ALSA_CHECK(snd_pcm_hw_params_set_channels(data->capture_handle, data->hw_params, al_get_channel_count(r->chan_conf)));
   ALSA_CHECK(snd_pcm_hw_params(data->capture_handle, data->hw_params));
   
   ALSA_CHECK(snd_pcm_prepare(data->capture_handle));
   
   r->extra = data;
   r->thread = al_create_thread(alsa_update_recorder, r);
   
   return 0;
   
Error:
   
   if (data) {
      if (data->hw_params) {
         snd_pcm_hw_params_free(data->hw_params);
      }
      if (data->capture_handle) {
         snd_pcm_close(data->capture_handle);
      }
      al_free(data);
   }
   
   return 1;
}